

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

void __thiscall
libtorrent::resolver::on_lookup
          (resolver *this,error_code *ec,iterator *i,callback_t *h,string *hostname)

{
  long lVar1;
  pointer paVar2;
  long lVar3;
  bool bVar4;
  iterator k;
  mapped_type *pmVar5;
  time_point tVar6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  _Var7;
  long lVar8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  __it;
  resolver *this_00;
  undefined1 local_78 [24];
  ulong local_60;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_50;
  resolver *local_48;
  callback_t *local_40;
  error_code *local_38;
  
  if (ec->failed_ == true) {
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    callback(this,h,ec,
             (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)local_78
            );
    std::_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
    ~_Vector_base((_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                   *)local_78);
  }
  else {
    local_50 = &(this->m_cache)._M_h;
    local_48 = this;
    local_40 = h;
    local_38 = ec;
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_50,hostname);
    tVar6 = aux::time_now();
    (pmVar5->last_seen).__d.__r = (rep)tVar6.__d.__r;
    paVar2 = (pmVar5->addresses).
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar5->addresses).
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar2) {
      (pmVar5->addresses).
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar2;
    }
    while( true ) {
      local_78._0_8_ = (pointer)0x0;
      local_78._8_8_ = (pointer)0x0;
      local_78._16_8_ = (pointer)0x0;
      bVar4 = boost::asio::ip::operator!=
                        (i,(basic_resolver_iterator<boost::asio::ip::tcp> *)local_78);
      this_00 = (resolver *)(local_78 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      if (!bVar4) break;
      lVar8 = i->index_ * 0x60;
      lVar3 = (long)(((i->values_).
                      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                    super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      lVar1 = lVar3 + lVar8;
      local_78[0] = *(short *)(lVar3 + lVar8) != 2;
      if ((bool)local_78[0]) {
        local_60 = (ulong)*(uint *)(lVar1 + 0x18);
        local_78._8_8_ = *(undefined8 *)(lVar1 + 8);
        local_78._16_8_ = *(undefined8 *)(lVar1 + 0x10);
        local_78._4_4_ = 0;
      }
      else {
        local_78._4_4_ = *(undefined4 *)(lVar1 + 4);
        local_78._8_8_ = (pointer)0x0;
        local_78._16_8_ = (pointer)0x0;
        local_60 = 0;
      }
      local_78._1_3_ = 0;
      std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
      emplace_back<boost::asio::ip::address>(&pmVar5->addresses,(address *)local_78);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(i);
    }
    callback(this_00,local_40,local_38,&pmVar5->addresses);
    if (local_48->m_max_size < (int)(local_48->m_cache)._M_h._M_element_count) {
      _Var7._M_cur = (__node_type *)(local_48->m_cache)._M_h._M_before_begin._M_nxt;
      __it._M_cur = _Var7._M_cur;
      for (; _Var7._M_cur != (__node_type *)0x0;
          _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var7._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it._M_cur + 0x28)) {
          __it._M_cur = _Var7._M_cur;
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(local_50,(const_iterator)__it._M_cur);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::iterator i
		, resolver_interface::callback_t const& h, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			callback(h, ec, {});
			return;
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = aux::time_now();
		ce.addresses.clear();
		while (i != tcp::resolver::iterator())
		{
			ce.addresses.push_back(i->endpoint().address());
			++i;
		}

		callback(h, ec, ce.addresses);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}